

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O1

bool ast::Sections::address_is_free(Section *s)

{
  uint uVar1;
  bool bVar2;
  _List_node_base *p_Var3;
  char cVar4;
  undefined8 *puVar5;
  
  puVar5 = &list_abi_cxx11_;
  do {
    puVar5 = (undefined8 *)*puVar5;
    if (puVar5 == &list_abi_cxx11_) goto LAB_00123780;
    uVar1 = *(uint *)(puVar5[2] + 0x24);
    cVar4 = '\x02';
    if (uVar1 < s->content_size + s->base_address) {
      cVar4 = s->base_address < uVar1 + *(int *)(puVar5[2] + 0x30);
    }
  } while (cVar4 == '\0');
  if (cVar4 == '\x02') {
LAB_00123780:
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = (_List_node_base *)s;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    _DAT_0013dab8 = _DAT_0013dab8 + 1;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Sections::address_is_free(Section *s)
{
	auto iter = list.begin();
	for (; iter != list.end(); ++iter) {
		Section *r = *iter;
		if (s->base_address + s->content_size > r->base_address
				&& r->base_address + r->content_size > s->base_address)
			return false;
		if (s->base_address + s->content_size <= r->base_address)
			break;
	}
	list.insert(iter, s);
	return true;
}